

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool kratos::is_unary_op(ExprOp op)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  __hash_code __code;
  __node_base_ptr p_Var3;
  __node_base_ptr p_Var4;
  bool bVar5;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined1 local_20 [13];
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  if ((is_unary_op(kratos::ExprOp)::ops == '\0') &&
     (iVar2 = __cxa_guard_acquire(&is_unary_op(kratos::ExprOp)::ops), iVar2 != 0)) {
    local_38 = 6;
    uStack_30 = 0;
    local_48 = 3;
    uStack_40 = 4;
    local_58 = 6;
    uStack_54 = 0;
    uStack_50 = 2;
    uStack_4c = 0;
    local_28 = 1;
    std::
    _Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<kratos::ExprOp_const*>
              ((_Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&is_unary_op::ops,&local_58,local_20,0,&local_13,&local_12,&local_11);
    __cxa_atexit(std::
                 unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
                 ::~unordered_set,&is_unary_op::ops,&__dso_handle);
    __cxa_guard_release(&is_unary_op(kratos::ExprOp)::ops);
  }
  p_Var3 = is_unary_op::ops._M_h._M_buckets[op % is_unary_op::ops._M_h._M_bucket_count];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var3->_M_nxt, p_Var4 = p_Var3, p_Var3->_M_nxt[1]._M_nxt != (_Hash_node_base *)op))
  {
    while (p_Var3 = p_Var1, p_Var1 = p_Var3->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)p_Var1[1]._M_nxt % is_unary_op::ops._M_h._M_bucket_count !=
           op % is_unary_op::ops._M_h._M_bucket_count) ||
         (p_Var4 = p_Var3, p_Var1[1]._M_nxt == (_Hash_node_base *)op)) goto LAB_0017dbfc;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_0017dbfc:
  if (p_Var4 == (__node_base_ptr)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = p_Var4->_M_nxt != (_Hash_node_base *)0x0;
  }
  return bVar5;
}

Assistant:

bool is_unary_op(ExprOp op) {
    static std::unordered_set<ExprOp> ops = {ExprOp::UXor,  ExprOp::UPlus, ExprOp::UOr,
                                             ExprOp::UNot,  ExprOp::UXor,  ExprOp::UInvert,
                                             ExprOp::UMinus};
    return ops.find(op) != ops.end();
}